

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint32_t FACTAudioEngine_Release(FACTAudioEngine *pEngine)

{
  uint32_t uVar1;
  
  FAudio_PlatformLockMutex(pEngine->apiLock);
  pEngine->refcount = pEngine->refcount - 1;
  if (pEngine->refcount == 0) {
    FACTAudioEngine_ShutDown(pEngine);
    FAudio_PlatformDestroyMutex(pEngine->sbLock);
    FAudio_PlatformDestroyMutex(pEngine->wbLock);
    FAudio_PlatformUnlockMutex(pEngine->apiLock);
    FAudio_PlatformDestroyMutex(pEngine->apiLock);
    if (pEngine->settings != (void *)0x0) {
      (*pEngine->pFree)(pEngine->settings);
    }
    (*pEngine->pFree)(pEngine);
    FAudio_PlatformRelease();
    uVar1 = 0;
  }
  else {
    FAudio_PlatformUnlockMutex(pEngine->apiLock);
    uVar1 = pEngine->refcount;
  }
  return uVar1;
}

Assistant:

uint32_t FACTAudioEngine_Release(FACTAudioEngine *pEngine)
{
	FAudio_PlatformLockMutex(pEngine->apiLock);
	pEngine->refcount -= 1;
	if (pEngine->refcount > 0)
	{
		FAudio_PlatformUnlockMutex(pEngine->apiLock);
		return pEngine->refcount;
	}
	FACTAudioEngine_ShutDown(pEngine);
	FAudio_PlatformDestroyMutex(pEngine->sbLock);
	FAudio_PlatformDestroyMutex(pEngine->wbLock);
	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	FAudio_PlatformDestroyMutex(pEngine->apiLock);
	if (pEngine->settings != NULL)
	{
		pEngine->pFree(pEngine->settings);
	}
	pEngine->pFree(pEngine);
	FAudio_PlatformRelease();
	return 0;
}